

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O1

int get_bool_option(JSContext *ctx,BOOL *pbool,JSValue obj,char *option)

{
  int iVar1;
  uint uVar2;
  JSValue val;
  
  val = JS_GetPropertyStr(ctx,obj,option);
  uVar2 = (uint)val.tag;
  if (uVar2 != 3) {
    if (uVar2 == 6) {
      return -1;
    }
    iVar1 = JS_ToBool(ctx,val);
    *pbool = iVar1;
  }
  if ((0xfffffff4 < uVar2) && (iVar1 = *val.u.ptr, *(int *)val.u.ptr = iVar1 + -1, iVar1 < 2)) {
    __JS_FreeValue(ctx,val);
  }
  return 0;
}

Assistant:

static int get_bool_option(JSContext *ctx, BOOL *pbool,
                           JSValueConst obj,
                           const char *option)
{
    JSValue val;
    val = JS_GetPropertyStr(ctx, obj, option);
    if (JS_IsException(val))
        return -1;
    if (!JS_IsUndefined(val)) {
        *pbool = JS_ToBool(ctx, val);
    }
    JS_FreeValue(ctx, val);
    return 0;
}